

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::from_hex_to_i(string *s,size_t i,size_t cnt,int *val)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  int local_34;
  int *piStack_30;
  int v;
  int *val_local;
  size_t cnt_local;
  size_t i_local;
  string *s_local;
  
  piStack_30 = val;
  val_local = (int *)cnt;
  cnt_local = i;
  i_local = (size_t)s;
  uVar2 = std::__cxx11::string::size();
  if (i < uVar2) {
    *piStack_30 = 0;
    for (; val_local != (int *)0x0; val_local = (int *)((long)val_local + -1)) {
      pcVar3 = (char *)std::__cxx11::string::operator[](i_local);
      if (*pcVar3 == '\0') {
        return false;
      }
      local_34 = 0;
      pcVar3 = (char *)std::__cxx11::string::operator[](i_local);
      bVar1 = is_hex(*pcVar3,&local_34);
      if (!bVar1) {
        return false;
      }
      *piStack_30 = *piStack_30 * 0x10 + local_34;
      cnt_local = cnt_local + 1;
    }
    s_local._7_1_ = true;
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

inline bool from_hex_to_i(const std::string &s, size_t i, size_t cnt,
								  int &val) {
			if (i >= s.size()) { return false; }

			val = 0;
			for (; cnt; i++, cnt--) {
				if (!s[i]) { return false; }
				int v = 0;
				if (is_hex(s[i], v)) {
					val = val * 16 + v;
				} else {
					return false;
				}
			}
			return true;
		}